

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O1

void __thiscall sfc::Image::Image(Image *this,Image *image,Subpalette *subpalette)

{
  channel_vec_t *this_00;
  rgba_vec_t *__return_storage_ptr__;
  rgba_set_t *this_01;
  uint uVar1;
  _Rb_tree_header *p_Var2;
  pointer puVar3;
  pointer puVar4;
  void *pvVar5;
  rgba_t color;
  uint uVar6;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var7
  ;
  ulong uVar8;
  runtime_error *prVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  rgba_vec_t rgba_v;
  rgba_vec_t local_a0;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_88;
  rgba_vec_t *local_58;
  index_vec_t *local_50;
  _Base_ptr local_48;
  ulong local_40;
  Image *local_38;
  
  this->_width = image->_width;
  this->_height = image->_height;
  this_00 = &this->_data;
  __return_storage_ptr__ = &this->_palette;
  (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = &this->_indexed_data;
  local_38 = image;
  Subpalette::normalized_colors(__return_storage_ptr__,subpalette);
  this_01 = &this->_colors;
  local_48 = &(this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_48;
  (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_48;
  (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58 = __return_storage_ptr__;
  if ((this->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"No colors");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar12 = this->_height * this->_width;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->_indexed_data,(ulong)uVar12);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,(ulong)(uVar12 * 4));
  if (uVar12 != 0) {
    uVar13 = 3;
    uVar16 = 0;
    local_40 = (ulong)uVar12;
    do {
      uVar15 = uVar13 - 3;
      puVar3 = (local_38->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar12 = uVar13 - 2;
      uVar1 = uVar13 - 1;
      uVar14 = (ulong)uVar13;
      color = reduce_color(CONCAT13(puVar3[uVar14],
                                    CONCAT12(puVar3[uVar1],CONCAT11(puVar3[uVar12],puVar3[uVar15])))
                           ,subpalette->_mode);
      local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = normalize_color(color,subpalette->_mode);
      if ((rgba_t)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start == 0) {
        (this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar16] = '\0';
        local_88._M_impl._0_4_ = 0;
        puVar3 = (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (uVar14 <= (ulong)((long)(this->_data).
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3)) {
          puVar3[uVar15] = '\0';
          (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar12] = '\0';
          (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar1] = '\0';
          (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar14] = '\0';
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)this_01,(uint *)&local_88);
        }
      }
      else {
        _Var7 = std::
                __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                          ((this->_palette).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (this->_palette).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_a0);
        puVar4 = (this->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar8 = (long)_Var7._M_current - (long)puVar4;
        if ((ulong)((long)(this->_palette).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar4) <= uVar8) {
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar9,"Color not in palette");
          __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        (this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar16] = (uchar)(uVar8 >> 2);
        uVar6 = *(uint *)((long)(this->_palette).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start + uVar8);
        uVar10 = uVar6 & 0xff000000;
        if (-1 < (int)uVar6) {
          uVar10 = 0;
          uVar6 = 0;
        }
        uVar11 = uVar6 & 0xffffff;
        puVar3 = (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_88._M_impl._0_4_ = uVar11 | uVar10;
        if (uVar14 <= (ulong)((long)(this->_data).
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3)) {
          puVar3[uVar15] = (uchar)uVar6;
          local_88._M_impl._1_1_ = SUB41(uVar11 >> 8,0);
          (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar12] = local_88._M_impl._1_1_;
          local_88._M_impl._2_1_ = SUB41(uVar11 >> 0x10,0);
          (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar1] = local_88._M_impl._2_1_;
          local_88._M_impl._3_1_ = SUB41(uVar10 >> 0x18,0);
          (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar14] = local_88._M_impl._3_1_;
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)this_01,(uint *)&local_88);
        }
      }
      uVar16 = uVar16 + 1;
      uVar13 = uVar13 + 4;
    } while (local_40 != uVar16);
  }
  this->_src_coord_x = 0;
  this->_src_coord_y = 0;
  to_rgba(&local_a0,this_00);
  _Var7._M_current._4_4_ =
       local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  _Var7._M_current._0_4_ =
       (rgba_t)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
  std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
  set<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)&local_88,
             _Var7,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::clear(&this_01->_M_t);
  if (local_88._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var2 = &local_88._M_impl.super__Rb_tree_header;
    (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_88._M_impl.super__Rb_tree_header._M_header._M_color;
    (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_88._M_impl.super__Rb_tree_header._M_header._M_parent;
    (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_88._M_impl.super__Rb_tree_header._M_header._M_left;
    (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_88._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_88._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = local_48;
    (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_88._M_impl.super__Rb_tree_header._M_node_count;
    local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_88._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_88._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_88);
  pvVar5 = (void *)CONCAT44(local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            (rgba_t)local_a0.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,(long)local_a0.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar5);
  }
  return;
}

Assistant:

Image::Image(const Image& image, const sfc::Subpalette& subpalette)
    : _width(image.width()), _height(image.height()), _palette(subpalette.normalized_colors()) {
  if (_palette.empty())
    throw std::runtime_error("No colors");

  unsigned size = _width * _height;
  _indexed_data.resize(size);
  _data.resize(size * 4);

  for (unsigned i = 0; i < size; ++i) {
    rgba_t color = sfc::normalize_color(sfc::reduce_color(image.rgba_color_at(i), subpalette.mode()), subpalette.mode());
    if (color == transparent_color) {
      _indexed_data[i] = 0;
      set_pixel(transparent_color, i);
    } else {
      size_t palette_index = std::find(_palette.begin(), _palette.end(), color) - _palette.begin();
      if (palette_index < _palette.size()) {
        _indexed_data[i] = (index_t)palette_index;
        set_pixel(sfc::rgba_color(_palette[palette_index]), i);
      } else {
        throw std::runtime_error("Color not in palette");
      }
    }
  }

  _src_coord_x = _src_coord_y = 0;

  auto rgba_v = rgba_data();
  _colors = rgba_set_t(rgba_v.begin(), rgba_v.end());
}